

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O3

void __thiscall slang::driver::Driver::addParseOptions(Driver *this,Bag *bag)

{
  size_t *psVar1;
  _Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_> *p_Var2;
  group_type_pointer pgVar3;
  unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>
  *puVar4;
  undefined4 uVar5;
  pointer key;
  ParserOptions len;
  int *piVar6;
  value_type_pointer ppVar7;
  ulong uVar8;
  long *plVar9;
  group_type_pointer pgVar10;
  uint uVar11;
  _Alloc_hider *p_Var12;
  group_type_pointer pgVar13;
  value_type_pointer ppVar14;
  basic_string_view<char,_std::char_traits<char>_> *__x;
  Bag *this_00;
  bool bVar15;
  byte bVar16;
  int iVar17;
  uint uVar18;
  mapped_type *pmVar19;
  uint64_t uVar20;
  group_type_pointer pgVar21;
  basic_string_view<char,_std::char_traits<char>_> *hash;
  ulong uVar22;
  value_type *elements_1;
  value_type_pointer pbVar23;
  ulong uVar24;
  size_type __rlen;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
  *ppVar25;
  pointer pbVar26;
  size_t sVar27;
  long lVar28;
  ulong uVar29;
  pointer pbVar30;
  value_type_pointer pos0;
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
  *ppVar31;
  pointer ptVar32;
  uchar uVar34;
  uchar uVar40;
  uchar uVar42;
  byte bVar44;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  char cVar54;
  uchar uVar55;
  char cVar56;
  uchar uVar57;
  char cVar58;
  uchar uVar59;
  char cVar60;
  byte bVar61;
  char cVar62;
  uchar uVar63;
  char cVar64;
  uchar uVar65;
  char cVar66;
  uchar uVar67;
  char cVar68;
  byte bVar69;
  char cVar70;
  uchar uVar71;
  char cVar72;
  uchar uVar73;
  char cVar74;
  uchar uVar75;
  char cVar76;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  byte bVar77;
  locator res_1;
  locator res;
  value_type *elements;
  size_t pos;
  PreprocessorOptions ppoptions;
  try_emplace_args_t local_2a9;
  undefined1 local_2a8 [16];
  pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
  *local_298;
  basic_string_view<char,_std::char_traits<char>_> local_290;
  basic_string_view<char,_std::char_traits<char>_> local_280;
  LexerOptions local_270;
  pointer local_230;
  undefined8 local_228;
  char cStack_220;
  char cStack_21f;
  char cStack_21e;
  char cStack_21d;
  char cStack_21c;
  char cStack_21b;
  char cStack_21a;
  char cStack_219;
  ulong local_210;
  pointer local_208;
  value_type_pointer local_200;
  pointer local_1f8;
  size_t local_1f0;
  Driver *local_1e8;
  group_type_pointer local_1e0;
  pointer local_1d8;
  group_type_pointer local_1d0;
  SourceOptions local_1c8;
  undefined8 local_1b8;
  uchar uStack_1b0;
  uchar uStack_1af;
  uchar uStack_1ae;
  byte bStack_1ad;
  uchar uStack_1ac;
  uchar uStack_1ab;
  uchar uStack_1aa;
  byte bStack_1a9;
  Bag *local_1a0;
  undefined1 local_198 [40];
  undefined1 local_170 [24];
  undefined1 auStack_158 [24];
  undefined1 local_140 [16];
  pointer local_130;
  size_t local_128;
  ulong local_120;
  pointer local_118;
  value_type_pointer local_110;
  size_ctrl_type local_108;
  uchar local_f8;
  uchar uStack_f7;
  uchar uStack_f6;
  byte bStack_f5;
  uchar uStack_f4;
  uchar uStack_f3;
  uchar uStack_f2;
  byte bStack_f1;
  uchar uStack_f0;
  uchar uStack_ef;
  uchar uStack_ee;
  byte bStack_ed;
  uchar uStack_ec;
  uchar uStack_eb;
  uchar uStack_ea;
  byte bStack_e9;
  uchar local_e8;
  uchar uStack_e7;
  uchar uStack_e6;
  byte bStack_e5;
  uchar uStack_e4;
  uchar uStack_e3;
  uchar uStack_e2;
  byte bStack_e1;
  uchar uStack_e0;
  uchar uStack_df;
  uchar uStack_de;
  byte bStack_dd;
  uchar uStack_dc;
  uchar uStack_db;
  uchar uStack_da;
  byte bStack_d9;
  uchar local_d8;
  uchar uStack_d7;
  uchar uStack_d6;
  byte bStack_d5;
  uchar uStack_d4;
  uchar uStack_d3;
  uchar uStack_d2;
  byte bStack_d1;
  uchar uStack_d0;
  uchar uStack_cf;
  uchar uStack_ce;
  byte bStack_cd;
  uchar uStack_cc;
  uchar uStack_cb;
  uchar uStack_ca;
  byte bStack_c9;
  uchar local_c8;
  uchar uStack_c7;
  uchar uStack_c6;
  byte bStack_c5;
  uchar uStack_c4;
  uchar uStack_c3;
  uchar uStack_c2;
  byte bStack_c1;
  uchar uStack_c0;
  uchar uStack_bf;
  uchar uStack_be;
  byte bStack_bd;
  uchar uStack_bc;
  uchar uStack_bb;
  uchar uStack_ba;
  byte bStack_b9;
  uchar local_b8;
  uchar uStack_b7;
  uchar uStack_b6;
  byte bStack_b5;
  uchar uStack_b4;
  uchar uStack_b3;
  uchar uStack_b2;
  byte bStack_b1;
  uchar uStack_b0;
  uchar uStack_af;
  uchar uStack_ae;
  byte bStack_ad;
  uchar uStack_ac;
  uchar uStack_ab;
  uchar uStack_aa;
  byte bStack_a9;
  uchar local_a8;
  uchar uStack_a7;
  uchar uStack_a6;
  byte bStack_a5;
  uchar uStack_a4;
  uchar uStack_a3;
  uchar uStack_a2;
  byte bStack_a1;
  uchar uStack_a0;
  uchar uStack_9f;
  uchar uStack_9e;
  byte bStack_9d;
  uchar uStack_9c;
  uchar uStack_9b;
  uchar uStack_9a;
  byte bStack_99;
  uchar local_98;
  uchar uStack_97;
  uchar uStack_96;
  byte bStack_95;
  uchar uStack_94;
  uchar uStack_93;
  uchar uStack_92;
  byte bStack_91;
  uchar uStack_90;
  uchar uStack_8f;
  uchar uStack_8e;
  byte bStack_8d;
  uchar uStack_8c;
  uchar uStack_8b;
  uchar uStack_8a;
  byte bStack_89;
  uchar local_88;
  uchar uStack_87;
  uchar uStack_86;
  byte bStack_85;
  uchar uStack_84;
  uchar uStack_83;
  uchar uStack_82;
  byte bStack_81;
  uchar uStack_80;
  uchar uStack_7f;
  uchar uStack_7e;
  byte bStack_7d;
  uchar uStack_7c;
  uchar uStack_7b;
  uchar uStack_7a;
  byte bStack_79;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  byte bStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  byte bStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  byte bStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  byte bStack_69;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  char local_48;
  char cStack_47;
  char cStack_46;
  char cStack_45;
  char cStack_44;
  char cStack_43;
  char cStack_42;
  char cStack_41;
  char cStack_40;
  char cStack_3f;
  char cStack_3e;
  char cStack_3d;
  char cStack_3c;
  char cStack_3b;
  char cStack_3a;
  char cStack_39;
  char cVar33;
  char cVar39;
  char cVar41;
  char cVar43;
  
  local_1c8.numThreads.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int> =
       *(_Optional_base<unsigned_int,_true,_true> *)
        &(this->options).numThreads.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>;
  local_1c8.singleUnit =
       (bool)((this->options).singleUnit.super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool>._M_payload._M_value != false &
             (this->options).singleUnit.super__Optional_base<bool,_true,_true>._M_payload.
             super__Optional_payload_base<bool>._M_engaged);
  local_198._0_4_ = 0x40;
  pmVar19 = std::
            map<slang::ast::CompilationFlags,_std::optional<bool>,_std::less<slang::ast::CompilationFlags>,_std::allocator<std::pair<const_slang::ast::CompilationFlags,_std::optional<bool>_>_>_>
            ::at(&(this->options).compilationFlags,(key_type *)local_198);
  local_1c8.onlyLint =
       (bool)((pmVar19->super__Optional_base<bool,_true,_true>)._M_payload.
              super__Optional_payload_base<bool>._M_payload._M_value != false &
             (pmVar19->super__Optional_base<bool,_true,_true>)._M_payload.
             super__Optional_payload_base<bool>._M_engaged);
  local_1c8.librariesInheritMacros =
       (bool)((this->options).librariesInheritMacros.super__Optional_base<bool,_true,_true>.
              _M_payload.super__Optional_payload_base<bool>._M_payload._M_value != false &
             (this->options).librariesInheritMacros.super__Optional_base<bool,_true,_true>.
             _M_payload.super__Optional_payload_base<bool>._M_engaged);
  local_198._0_4_ = 0x400;
  local_198._4_4_ = Default;
  local_198._8_8_ = local_198 + 0x18;
  local_198._24_4_ = 0x6970613c;
  local_198._28_2_ = 0x3e;
  local_198._16_8_ = 5;
  local_170._0_16_ = (undefined1  [16])0x0;
  stack0xfffffffffffffea0 = (undefined1  [16])0x0;
  auStack_158._8_16_ = (undefined1  [16])0x0;
  local_140 = (undefined1  [16])0x0;
  local_130 = (pointer)0x0;
  local_128 = 0x3f;
  local_120 = 1;
  local_110 = (value_type_pointer)0x0;
  local_118 = (pointer)&boost::unordered::detail::foa::
                        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                        ::storage;
  local_108.ml = 0;
  local_108.size = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_170,&(this->options).defines);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_158,&(this->options).undefines);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_198 + 8),0,
             local_198._16_8_,"<command-line>",0xe);
  local_270.languageVersion = this->languageVersion;
  if ((this->options).maxIncludeDepth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    local_198._0_4_ =
         (this->options).maxIncludeDepth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_payload._M_value;
  }
  local_198._4_4_ = local_270.languageVersion;
  pbVar30 = (this->options).ignoreDirectives.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_208 = (this->options).ignoreDirectives.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_1e8 = this;
  local_1a0 = bag;
  if (pbVar30 != local_208) {
    do {
      key = (pbVar30->_M_dataplus)._M_p;
      len = (ParserOptions)pbVar30->_M_string_length;
      local_2a8._0_8_ = len;
      local_2a8._8_8_ = key;
      local_1f8 = (pointer)detail::hashing::hash(key,(size_t)len);
      sVar27 = (ulong)local_1f8 >> ((byte)local_128._0_1_ & 0x3f);
      lVar28 = ((ulong)local_1f8 & 0xff) * 4;
      cVar33 = (&UNK_0047072c)[lVar28];
      cVar39 = (&UNK_0047072d)[lVar28];
      cVar41 = (&UNK_0047072e)[lVar28];
      cVar43 = (&UNK_0047072f)[lVar28];
      local_200 = local_110;
      local_230 = (pointer)(ulong)((uint)local_1f8 & 7);
      local_210 = local_120;
      uVar24 = 0;
      local_1d8 = local_118;
      cVar54 = cVar33;
      cVar56 = cVar39;
      cVar58 = cVar41;
      cVar60 = cVar43;
      cVar62 = cVar33;
      cVar64 = cVar39;
      cVar66 = cVar41;
      cVar68 = cVar43;
      cVar70 = cVar33;
      cVar72 = cVar39;
      cVar74 = cVar41;
      cVar76 = cVar43;
      local_1b8 = sVar27;
      do {
        pbVar23 = local_200;
        p_Var2 = &(local_1d8->
                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  ).
                  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_> +
                 sVar27;
        local_48 = (char)(p_Var2->
                         super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                         )._M_head_impl._M_len;
        cStack_47 = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_len + 1);
        cStack_46 = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_len + 2);
        cStack_45 = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_len + 3);
        cStack_44 = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_len + 4);
        cStack_43 = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_len + 5);
        cStack_42 = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_len + 6);
        cStack_41 = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_len + 7);
        cStack_40 = *(char *)&(p_Var2->
                              super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                              )._M_head_impl._M_str;
        cStack_3f = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_str + 1);
        cStack_3e = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_str + 2);
        cStack_3d = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_str + 3);
        cStack_3c = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_str + 4);
        cStack_3b = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_str + 5);
        cStack_3a = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_str + 6);
        cStack_39 = *(char *)((long)&(p_Var2->
                                     super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                                     )._M_head_impl._M_str + 7);
        auVar35[0] = -(local_48 == cVar33);
        auVar35[1] = -(cStack_47 == cVar39);
        auVar35[2] = -(cStack_46 == cVar41);
        auVar35[3] = -(cStack_45 == cVar43);
        auVar35[4] = -(cStack_44 == cVar54);
        auVar35[5] = -(cStack_43 == cVar56);
        auVar35[6] = -(cStack_42 == cVar58);
        auVar35[7] = -(cStack_41 == cVar60);
        auVar35[8] = -(cStack_40 == cVar62);
        auVar35[9] = -(cStack_3f == cVar64);
        auVar35[10] = -(cStack_3e == cVar66);
        auVar35[0xb] = -(cStack_3d == cVar68);
        auVar35[0xc] = -(cStack_3c == cVar70);
        auVar35[0xd] = -(cStack_3b == cVar72);
        auVar35[0xe] = -(cStack_3a == cVar74);
        auVar35[0xf] = -(cStack_39 == cVar76);
        local_1d0 = (group_type_pointer)CONCAT71(local_1d0._1_7_,cStack_39);
        uVar18 = (uint)(ushort)((ushort)(SUB161(auVar35 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar35 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar35 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar35 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar35 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar35 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar35 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar35 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar35 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar35 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar35 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar35 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar35 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar35 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar35 >> 0x77,0) & 1) << 0xe);
        local_1f0 = sVar27;
        if (uVar18 != 0) {
          local_228 = (basic_string_view<char,_std::char_traits<char>_> *)
                      CONCAT17(cVar60,CONCAT16(cVar58,CONCAT15(cVar56,CONCAT14(cVar54,CONCAT13(
                                                  cVar43,CONCAT12(cVar41,CONCAT11(cVar39,cVar33)))))
                                              ));
          cStack_220 = cVar62;
          cStack_21f = cVar64;
          cStack_21e = cVar66;
          cStack_21d = cVar68;
          cStack_21c = cVar70;
          cStack_21b = cVar72;
          cStack_21a = cVar74;
          cStack_219 = cVar76;
          do {
            iVar17 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
              }
            }
            if (len == *(ParserOptions *)
                        ((long)&pbVar23[sVar27 * 0xf]._M_len + (ulong)(uint)(iVar17 << 4))) {
              if (len == (ParserOptions)0x0) goto LAB_0018e896;
              iVar17 = bcmp(key,*(void **)((long)&pbVar23[sVar27 * 0xf]._M_str +
                                          (ulong)(uint)(iVar17 << 4)),(size_t)len);
              cVar33 = (char)local_228;
              cVar39 = local_228._1_1_;
              cVar41 = local_228._2_1_;
              cVar43 = local_228._3_1_;
              cVar54 = local_228._4_1_;
              cVar56 = local_228._5_1_;
              cVar58 = local_228._6_1_;
              cVar60 = local_228._7_1_;
              cVar62 = cStack_220;
              cVar64 = cStack_21f;
              cVar66 = cStack_21e;
              cVar68 = cStack_21d;
              cVar70 = cStack_21c;
              cVar72 = cStack_21b;
              cVar74 = cStack_21a;
              cVar76 = cStack_219;
              if (iVar17 == 0) goto LAB_0018e896;
            }
            uVar18 = uVar18 - 1 & uVar18;
          } while (uVar18 != 0);
        }
        if ((*(byte *)&local_230[0x23859]._M_dataplus._M_p & (byte)local_1d0) == 0) break;
        lVar28 = local_1f0 + uVar24;
        uVar24 = uVar24 + 1;
        sVar27 = lVar28 + 1U & local_210;
      } while (uVar24 <= local_210);
      if (local_108.size < local_108.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::nosize_unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>>
                  ((locator *)&local_270,
                   (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&local_128,(arrays_type *)&local_128,local_1b8,(size_t)local_1f8,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_2a8);
        local_108.size = local_108.size + 1;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
        ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>>
                  ((locator *)&local_270,
                   (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                    *)&local_128,(size_t)local_1f8,
                   (basic_string_view<char,_std::char_traits<char>_> *)local_2a8);
      }
LAB_0018e896:
      pbVar30 = pbVar30 + 1;
    } while (pbVar30 != local_208);
    local_270.languageVersion = local_1e8->languageVersion;
  }
  local_270.commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.groups_size_index = 0x3f;
  local_270.commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.groups_size_mask = 1;
  local_270.commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.elements_ = (value_type_pointer)0x0;
  local_270.commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .arrays.groups_ =
       (group_type_pointer)
       &boost::unordered::detail::foa::
        dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
        ::storage;
  local_270.commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .size_ctrl.ml = 0;
  local_270.commentHandlers.table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
  .size_ctrl.size = 0;
  local_270.maxErrors = 0x10;
  local_270.enableLegacyProtect =
       (bool)((local_1e8->options).enableLegacyProtect.super__Optional_base<bool,_true,_true>.
              _M_payload.super__Optional_payload_base<bool>._M_payload._M_value != false &
             (local_1e8->options).enableLegacyProtect.super__Optional_base<bool,_true,_true>.
             _M_payload.super__Optional_payload_base<bool>._M_engaged);
  if ((local_1e8->options).maxLexerErrors.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    local_270.maxErrors =
         *(uint32_t *)
          &(local_1e8->options).maxLexerErrors.super__Optional_base<unsigned_int,_true,_true>.
           _M_payload.super__Optional_payload_base<unsigned_int>._M_payload;
  }
  if (local_270.enableLegacyProtect != false) {
    local_280._M_len = 6;
    local_280._M_str = "pragma";
    uVar20 = detail::hashing::hash("pragma",6);
    uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar20 & 0xff];
    cVar33 = (char)uVar5;
    auVar36[0] = -(cVar33 == '\0');
    cVar39 = (char)((uint)uVar5 >> 8);
    auVar36[1] = -(cVar39 == '\0');
    cVar41 = (char)((uint)uVar5 >> 0x10);
    auVar36[2] = -(cVar41 == '\0');
    cVar43 = (char)((uint)uVar5 >> 0x18);
    auVar36[3] = -(cVar43 == '\0');
    auVar36[4] = -(cVar33 == '\0');
    auVar36[5] = -(cVar39 == '\0');
    auVar36[6] = -(cVar41 == '\0');
    auVar36[7] = -(cVar43 == '\0');
    auVar36[8] = -(cVar33 == '\0');
    auVar36[9] = -(cVar39 == '\0');
    auVar36[10] = -(cVar41 == '\0');
    auVar36[0xb] = -(cVar43 == '\0');
    auVar36[0xc] = -(cVar33 == '\0');
    auVar36[0xd] = -(cVar39 == '\0');
    auVar36[0xe] = -(cVar41 == '\x01');
    auVar36[0xf] = -(cVar43 == '\0');
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar36 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar36 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar36 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar36 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar36 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar36 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar36 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar36 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar36 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar36 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar36 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar36 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar36 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar36 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar36 >> 0x77,0) & 1) << 0xe);
    if (uVar18 != 0) {
      uVar24 = (ulong)((uint)((long)uVar20 >> 0x3f) & 0x3c0);
      do {
        iVar17 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
          }
        }
        if ((*(long *)(uVar24 + (uint)(iVar17 << 6)) == 6) &&
           (ppVar31 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                       *)((uint)(iVar17 << 6) + uVar24), piVar6 = (int *)(ppVar31->first)._M_str,
           (short)piVar6[1] == 0x616d && *piVar6 == 0x67617270)) goto LAB_0018ea07;
        uVar18 = uVar18 - 1 & uVar18;
      } while (uVar18 != 0);
    }
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&local_270,uVar20,(try_emplace_args_t *)&local_290,&local_280);
    ppVar31 = local_298;
LAB_0018ea07:
    local_228 = (basic_string_view<char,_std::char_traits<char>_> *)&ppVar31->second;
    local_290._M_len = 7;
    local_290._M_str = "protect";
    uVar20 = detail::hashing::hash("protect",7);
    uVar29 = uVar20 >> ((byte)(ppVar31->second).table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                              .arrays.groups_size_index & 0x3f);
    uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::match_word(unsigned_long)::word)[uVar20 & 0xff];
    uVar22 = 0;
    uVar24 = uVar29;
    do {
      pgVar21 = (ppVar31->second).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                .arrays.groups_ + uVar24;
      local_58 = pgVar21->m[0].n;
      uStack_57 = pgVar21->m[1].n;
      uStack_56 = pgVar21->m[2].n;
      bStack_55 = pgVar21->m[3].n;
      uStack_54 = pgVar21->m[4].n;
      uStack_53 = pgVar21->m[5].n;
      uStack_52 = pgVar21->m[6].n;
      bStack_51 = pgVar21->m[7].n;
      uStack_50 = pgVar21->m[8].n;
      uStack_4f = pgVar21->m[9].n;
      uStack_4e = pgVar21->m[10].n;
      bStack_4d = pgVar21->m[0xb].n;
      uStack_4c = pgVar21->m[0xc].n;
      uStack_4b = pgVar21->m[0xd].n;
      uStack_4a = pgVar21->m[0xe].n;
      bStack_49 = pgVar21->m[0xf].n;
      uVar34 = (uchar)uVar5;
      auVar45[0] = -(local_58 == uVar34);
      uVar40 = (uchar)((uint)uVar5 >> 8);
      auVar45[1] = -(uStack_57 == uVar40);
      uVar42 = (uchar)((uint)uVar5 >> 0x10);
      auVar45[2] = -(uStack_56 == uVar42);
      bVar44 = (byte)((uint)uVar5 >> 0x18);
      auVar45[3] = -(bStack_55 == bVar44);
      auVar45[4] = -(uStack_54 == uVar34);
      auVar45[5] = -(uStack_53 == uVar40);
      auVar45[6] = -(uStack_52 == uVar42);
      auVar45[7] = -(bStack_51 == bVar44);
      auVar45[8] = -(uStack_50 == uVar34);
      auVar45[9] = -(uStack_4f == uVar40);
      auVar45[10] = -(uStack_4e == uVar42);
      auVar45[0xb] = -(bStack_4d == bVar44);
      auVar45[0xc] = -(uStack_4c == uVar34);
      auVar45[0xd] = -(uStack_4b == uVar40);
      auVar45[0xe] = -(uStack_4a == uVar42);
      auVar45[0xf] = -(bStack_49 == bVar44);
      uVar18 = (uint)(ushort)((ushort)(SUB161(auVar45 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar45 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar45 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar45 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar45 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar45 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar45 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar45 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar45 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar45 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar45 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar45 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar45 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar45 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar45 >> 0x77,0) & 1) << 0xe);
      if (uVar18 != 0) {
        ppVar7 = (ppVar31->second).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                 .arrays.elements_;
        do {
          uVar11 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
            }
          }
          if ((ppVar7[uVar24 * 0xf + (ulong)uVar11].first._M_len == 7) &&
             (ppVar25 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                         *)(ppVar7 + uVar24 * 0xf + (ulong)uVar11),
             piVar6 = (int *)(ppVar25->first)._M_str,
             *(int *)((long)piVar6 + 3) == 0x74636574 && *piVar6 == 0x746f7270)) goto LAB_0018eb4b;
          uVar18 = uVar18 - 1 & uVar18;
        } while (uVar18 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bStack_49) == 0) break;
      uVar8 = (ppVar31->second).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
              .arrays.groups_size_mask;
      uVar24 = uVar22 + uVar24 + 1;
      uVar22 = uVar22 + 1;
      uVar24 = uVar24 & uVar8;
    } while (uVar22 <= uVar8);
    if ((ppVar31->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .size_ctrl.size <
        (ppVar31->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_2a8,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                  *)local_228,(arrays_type *)local_228,uVar29,uVar20,&local_2a9,&local_290);
      psVar1 = &(ppVar31->second).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      ppVar25 = local_298;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
                ((locator *)local_2a8,
                 (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                  *)local_228,uVar20,&local_2a9,&local_290);
      ppVar25 = local_298;
    }
LAB_0018eb4b:
    *(undefined4 *)
     &(ppVar25->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .arrays.groups_size_index = 0;
    (ppVar25->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_size_mask = 0;
    (ppVar25->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_ = (group_type_pointer)0x0;
  }
  ptVar32 = (local_1e8->translateOffFormats).
            super__Vector_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_1f8 = (local_1e8->translateOffFormats).
              super__Vector_base<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar32 != local_1f8) {
    do {
      pbVar30 = (pointer)&(ptVar32->
                          super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                          ).
                          super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
      ;
      local_228 = &(ptVar32->
                   super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   ).
                   super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                   .
                   super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                   ._M_head_impl;
      local_1f0 = (ptVar32->
                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  ).
                  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                  super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                  ._M_head_impl._M_len;
      local_1d0 = (group_type_pointer)
                  (ptVar32->
                  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  ).
                  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                  .super__Tuple_impl<2UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
                  super__Head_base<2UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                  ._M_head_impl._M_str;
      pgVar21 = (group_type_pointer)
                detail::hashing::hash
                          ((ptVar32->
                           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           ).
                           super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                           ._M_head_impl._M_str,
                           (ptVar32->
                           super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                           ).
                           super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                           ._M_head_impl._M_len);
      pos0 = (value_type_pointer)
             ((ulong)pgVar21 >>
             ((byte)local_270.commentHandlers.table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                    .arrays.groups_size_index & 0x3f));
      lVar28 = ((ulong)pgVar21 & 0xff) * 4;
      uVar34 = (&UNK_0047072c)[lVar28];
      uVar40 = (&UNK_0047072d)[lVar28];
      uVar42 = (&UNK_0047072e)[lVar28];
      bVar44 = (&UNK_0047072f)[lVar28];
      uVar24 = (ulong)((uint)pgVar21 & 7);
      pbVar26 = (pointer)0x0;
      pbVar23 = pos0;
      uVar55 = uVar34;
      uVar57 = uVar40;
      uVar59 = uVar42;
      bVar61 = bVar44;
      uVar63 = uVar34;
      uVar65 = uVar40;
      uVar67 = uVar42;
      bVar69 = bVar44;
      uVar71 = uVar34;
      uVar73 = uVar40;
      uVar75 = uVar42;
      bVar77 = bVar44;
      do {
        ppVar14 = local_270.commentHandlers.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                  .arrays.elements_;
        pgVar13 = local_270.commentHandlers.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                  .arrays.groups_;
        pgVar3 = local_270.commentHandlers.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                 .arrays.groups_ + (long)pbVar23;
        local_68 = pgVar3->m[0].n;
        uStack_67 = pgVar3->m[1].n;
        uStack_66 = pgVar3->m[2].n;
        bStack_65 = pgVar3->m[3].n;
        uStack_64 = pgVar3->m[4].n;
        uStack_63 = pgVar3->m[5].n;
        uStack_62 = pgVar3->m[6].n;
        bStack_61 = pgVar3->m[7].n;
        uStack_60 = pgVar3->m[8].n;
        uStack_5f = pgVar3->m[9].n;
        uStack_5e = pgVar3->m[10].n;
        bStack_5d = pgVar3->m[0xb].n;
        uStack_5c = pgVar3->m[0xc].n;
        uStack_5b = pgVar3->m[0xd].n;
        uStack_5a = pgVar3->m[0xe].n;
        bVar16 = pgVar3->m[0xf].n;
        auVar37[0] = -(local_68 == uVar34);
        auVar37[1] = -(uStack_67 == uVar40);
        auVar37[2] = -(uStack_66 == uVar42);
        auVar37[3] = -(bStack_65 == bVar44);
        auVar37[4] = -(uStack_64 == uVar55);
        auVar37[5] = -(uStack_63 == uVar57);
        auVar37[6] = -(uStack_62 == uVar59);
        auVar37[7] = -(bStack_61 == bVar61);
        auVar37[8] = -(uStack_60 == uVar63);
        auVar37[9] = -(uStack_5f == uVar65);
        auVar37[10] = -(uStack_5e == uVar67);
        auVar37[0xb] = -(bStack_5d == bVar69);
        auVar37[0xc] = -(uStack_5c == uVar71);
        auVar37[0xd] = -(uStack_5b == uVar73);
        auVar37[0xe] = -(uStack_5a == uVar75);
        auVar37[0xf] = -(bVar16 == bVar77);
        uVar18 = (uint)(ushort)((ushort)(SUB161(auVar37 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar37 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar37 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar37 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar37 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar37 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar37 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar37 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar37 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar37 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar37 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar37 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar37 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar37 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar37 >> 0x77,0) & 1) << 0xe);
        bStack_59 = bVar16;
        if (uVar18 != 0) {
          local_1b8._0_2_ = CONCAT11(uVar40,uVar34);
          local_1b8._0_3_ = CONCAT12(uVar42,(undefined2)local_1b8);
          local_1b8._0_4_ = CONCAT13(bVar44,(undefined3)local_1b8);
          local_1b8._0_5_ = CONCAT14(uVar55,(undefined4)local_1b8);
          local_1b8._0_6_ = CONCAT15(uVar57,(undefined5)local_1b8);
          local_1b8._0_7_ = CONCAT16(uVar59,(undefined6)local_1b8);
          local_1b8 = CONCAT17(bVar61,(undefined7)local_1b8);
          local_230 = pbVar30;
          local_210 = uVar24;
          local_208 = pbVar26;
          local_200 = pbVar23;
          local_1e0 = pgVar21;
          uStack_1b0 = uVar63;
          uStack_1af = uVar65;
          uStack_1ae = uVar67;
          bStack_1ad = bVar69;
          uStack_1ac = uVar71;
          uStack_1ab = uVar73;
          uStack_1aa = uVar75;
          bStack_1a9 = bVar77;
          do {
            iVar17 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
              }
            }
            ppVar31 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                       *)((long)&ppVar14[(long)pbVar23 * 0xf].first._M_len +
                         (ulong)(uint)(iVar17 << 6));
            bVar15 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                     operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                                &local_270,
                                (basic_string_view<char,_std::char_traits<char>_> *)local_230,
                                (basic_string_view<char,_std::char_traits<char>_> *)ppVar31);
            if (bVar15) goto LAB_0018f853;
            uVar18 = uVar18 - 1 & uVar18;
          } while (uVar18 != 0);
          bVar16 = pgVar13[(long)pbVar23].m[0xf].n;
          pbVar23 = local_200;
          pbVar30 = local_230;
          pbVar26 = local_208;
          uVar24 = local_210;
          pgVar21 = local_1e0;
          uVar34 = (uchar)local_1b8;
          uVar40 = local_1b8._1_1_;
          uVar42 = local_1b8._2_1_;
          bVar44 = local_1b8._3_1_;
          uVar55 = local_1b8._4_1_;
          uVar57 = local_1b8._5_1_;
          uVar59 = local_1b8._6_1_;
          bVar61 = local_1b8._7_1_;
          uVar63 = uStack_1b0;
          uVar65 = uStack_1af;
          uVar67 = uStack_1ae;
          bVar69 = bStack_1ad;
          uVar71 = uStack_1ac;
          uVar73 = uStack_1ab;
          uVar75 = uStack_1aa;
          bVar77 = bStack_1a9;
        }
        if ((*(byte *)(uVar24 + 0x470b20) & bVar16) == 0) break;
        p_Var12 = &pbVar26->_M_dataplus;
        pbVar26 = (pointer)((long)&(pbVar26->_M_dataplus)._M_p + 1);
        pbVar23 = (value_type_pointer)
                  ((ulong)((long)&pbVar23->_M_len + (long)((long)&p_Var12->_M_p + 1)) &
                  local_270.commentHandlers.table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                  .arrays.groups_size_mask);
      } while (pbVar26 <=
               local_270.commentHandlers.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
               .arrays.groups_size_mask);
      if (local_270.commentHandlers.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
          .size_ctrl.size <
          local_270.commentHandlers.table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                  ((locator *)local_2a8,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                    *)&local_270,(arrays_type *)&local_270,(size_t)pos0,(size_t)pgVar21,
                   (try_emplace_args_t *)&local_280,
                   (basic_string_view<char,_std::char_traits<char>_> *)pbVar30);
        local_270.commentHandlers.table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
        .size_ctrl.size =
             local_270.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .size_ctrl.size + 1;
        ppVar31 = local_298;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                  ((locator *)local_2a8,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                    *)&local_270,(size_t)pgVar21,(try_emplace_args_t *)&local_280,
                   (basic_string_view<char,_std::char_traits<char>_> *)pbVar30);
        ppVar31 = local_298;
      }
LAB_0018f853:
      puVar4 = &ppVar31->second;
      hash = (basic_string_view<char,_std::char_traits<char>_> *)
             detail::hashing::hash
                       ((ptVar32->
                        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        ).
                        super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        .
                        super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                        ._M_head_impl._M_str,
                        (ptVar32->
                        super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        ).
                        super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
                        .
                        super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>
                        ._M_head_impl._M_len);
      __x = local_228;
      pbVar30 = (pointer)((ulong)hash >>
                         ((byte)(ppVar31->second).table_.
                                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                                .arrays.groups_size_index & 0x3f));
      lVar28 = ((ulong)hash & 0xff) * 4;
      uVar34 = (&UNK_0047072c)[lVar28];
      uVar40 = (&UNK_0047072d)[lVar28];
      uVar42 = (&UNK_0047072e)[lVar28];
      bVar44 = (&UNK_0047072f)[lVar28];
      pbVar23 = (value_type_pointer)(ulong)((uint)hash & 7);
      uVar24 = 0;
      pbVar26 = pbVar30;
      uVar55 = uVar34;
      uVar57 = uVar40;
      uVar59 = uVar42;
      bVar61 = bVar44;
      uVar63 = uVar34;
      uVar65 = uVar40;
      uVar67 = uVar42;
      bVar69 = bVar44;
      uVar71 = uVar34;
      uVar73 = uVar40;
      uVar75 = uVar42;
      bVar77 = bVar44;
      local_1d8 = ptVar32;
      do {
        pgVar10 = (ppVar31->second).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                  .arrays.groups_;
        pgVar21 = pgVar10 + (long)pbVar30;
        local_78 = pgVar21->m[0].n;
        uStack_77 = pgVar21->m[1].n;
        uStack_76 = pgVar21->m[2].n;
        bStack_75 = pgVar21->m[3].n;
        uStack_74 = pgVar21->m[4].n;
        uStack_73 = pgVar21->m[5].n;
        uStack_72 = pgVar21->m[6].n;
        bStack_71 = pgVar21->m[7].n;
        uStack_70 = pgVar21->m[8].n;
        uStack_6f = pgVar21->m[9].n;
        uStack_6e = pgVar21->m[10].n;
        bStack_6d = pgVar21->m[0xb].n;
        uStack_6c = pgVar21->m[0xc].n;
        uStack_6b = pgVar21->m[0xd].n;
        uStack_6a = pgVar21->m[0xe].n;
        bVar16 = pgVar21->m[0xf].n;
        auVar38[0] = -(local_78 == uVar34);
        auVar38[1] = -(uStack_77 == uVar40);
        auVar38[2] = -(uStack_76 == uVar42);
        auVar38[3] = -(bStack_75 == bVar44);
        auVar38[4] = -(uStack_74 == uVar55);
        auVar38[5] = -(uStack_73 == uVar57);
        auVar38[6] = -(uStack_72 == uVar59);
        auVar38[7] = -(bStack_71 == bVar61);
        auVar38[8] = -(uStack_70 == uVar63);
        auVar38[9] = -(uStack_6f == uVar65);
        auVar38[10] = -(uStack_6e == uVar67);
        auVar38[0xb] = -(bStack_6d == bVar69);
        auVar38[0xc] = -(uStack_6c == uVar71);
        auVar38[0xd] = -(uStack_6b == uVar73);
        auVar38[0xe] = -(uStack_6a == uVar75);
        auVar38[0xf] = -(bVar16 == bVar77);
        uVar18 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
        bStack_69 = bVar16;
        if (uVar18 != 0) {
          local_1b8._0_2_ = CONCAT11(uVar40,uVar34);
          local_1b8._0_3_ = CONCAT12(uVar42,(undefined2)local_1b8);
          local_1b8._0_4_ = CONCAT13(bVar44,(undefined3)local_1b8);
          local_1b8._0_5_ = CONCAT14(uVar55,(undefined4)local_1b8);
          local_1b8._0_6_ = CONCAT15(uVar57,(undefined5)local_1b8);
          local_1b8._0_7_ = CONCAT16(uVar59,(undefined6)local_1b8);
          local_1b8 = CONCAT17(bVar61,(undefined7)local_1b8);
          local_1e0 = pgVar10 + (long)pbVar30;
          ppVar7 = (ppVar31->second).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                   .arrays.elements_;
          local_230 = pbVar26;
          local_228 = hash;
          local_210 = uVar24;
          local_208 = pbVar30;
          local_200 = pbVar23;
          uStack_1b0 = uVar63;
          uStack_1af = uVar65;
          uStack_1ae = uVar67;
          bStack_1ad = bVar69;
          uStack_1ac = uVar71;
          uStack_1ab = uVar73;
          uStack_1aa = uVar75;
          bStack_1a9 = bVar77;
          do {
            uVar11 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
              }
            }
            ppVar25 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                       *)(ppVar7 + (long)pbVar30 * 0xf + (ulong)uVar11);
            bVar15 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                     operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                                puVar4,__x,
                                (basic_string_view<char,_std::char_traits<char>_> *)ppVar25);
            if (bVar15) goto LAB_0018f9f2;
            uVar18 = uVar18 - 1 & uVar18;
          } while (uVar18 != 0);
          bVar16 = local_1e0->m[0xf].n;
          hash = local_228;
          pbVar23 = local_200;
          pbVar30 = local_208;
          pbVar26 = local_230;
          uVar24 = local_210;
          uVar34 = (uchar)local_1b8;
          uVar40 = local_1b8._1_1_;
          uVar42 = local_1b8._2_1_;
          bVar44 = local_1b8._3_1_;
          uVar55 = local_1b8._4_1_;
          uVar57 = local_1b8._5_1_;
          uVar59 = local_1b8._6_1_;
          bVar61 = local_1b8._7_1_;
          uVar63 = uStack_1b0;
          uVar65 = uStack_1af;
          uVar67 = uStack_1ae;
          bVar69 = bStack_1ad;
          uVar71 = uStack_1ac;
          uVar73 = uStack_1ab;
          uVar75 = uStack_1aa;
          bVar77 = bStack_1a9;
        }
        if (((byte)pbVar23[0x470b2]._M_len & bVar16) == 0) break;
        uVar22 = (ppVar31->second).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                 .arrays.groups_size_mask;
        lVar28 = uVar24 + 1;
        uVar24 = uVar24 + 1;
        pbVar30 = (pointer)((long)&(pbVar30->_M_dataplus)._M_p + lVar28 & uVar22);
      } while (uVar24 <= uVar22);
      if ((ppVar31->second).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
          .size_ctrl.size <
          (ppVar31->second).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
        ::
        nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                  ((locator *)local_2a8,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                    *)puVar4,(arrays_type *)puVar4,(size_t)pbVar26,(size_t)hash,
                   (try_emplace_args_t *)&local_280,__x);
        psVar1 = &(ppVar31->second).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                  .size_ctrl.size;
        *psVar1 = *psVar1 + 1;
        ppVar25 = local_298;
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
        ::
        unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>const&>
                  ((locator *)local_2a8,
                   (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                    *)puVar4,(size_t)hash,(try_emplace_args_t *)&local_280,__x);
        ppVar25 = local_298;
      }
LAB_0018f9f2:
      *(undefined4 *)
       &(ppVar25->second).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
        .arrays.groups_size_index = 1;
      (ppVar25->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .arrays.groups_size_mask = local_1f0;
      (ppVar25->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .arrays.groups_ = local_1d0;
      ptVar32 = local_1d8 + 1;
    } while (ptVar32 != local_1f8);
  }
  local_280._M_len = 5;
  local_280._M_str = "slang";
  uVar20 = detail::hashing::hash("slang",5);
  uVar22 = uVar20 >> ((byte)local_270.commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar20 & 0xff];
  pbVar30 = (pointer)0x0;
  uVar24 = uVar22;
  do {
    pgVar3 = local_270.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_ + uVar24;
    local_88 = pgVar3->m[0].n;
    uStack_87 = pgVar3->m[1].n;
    uStack_86 = pgVar3->m[2].n;
    bStack_85 = pgVar3->m[3].n;
    uStack_84 = pgVar3->m[4].n;
    uStack_83 = pgVar3->m[5].n;
    uStack_82 = pgVar3->m[6].n;
    bStack_81 = pgVar3->m[7].n;
    uStack_80 = pgVar3->m[8].n;
    uStack_7f = pgVar3->m[9].n;
    uStack_7e = pgVar3->m[10].n;
    bStack_7d = pgVar3->m[0xb].n;
    uStack_7c = pgVar3->m[0xc].n;
    uStack_7b = pgVar3->m[0xd].n;
    uStack_7a = pgVar3->m[0xe].n;
    bStack_79 = pgVar3->m[0xf].n;
    uVar34 = (uchar)uVar5;
    auVar46[0] = -(local_88 == uVar34);
    uVar40 = (uchar)((uint)uVar5 >> 8);
    auVar46[1] = -(uStack_87 == uVar40);
    uVar42 = (uchar)((uint)uVar5 >> 0x10);
    auVar46[2] = -(uStack_86 == uVar42);
    bVar44 = (byte)((uint)uVar5 >> 0x18);
    auVar46[3] = -(bStack_85 == bVar44);
    auVar46[4] = -(uStack_84 == uVar34);
    auVar46[5] = -(uStack_83 == uVar40);
    auVar46[6] = -(uStack_82 == uVar42);
    auVar46[7] = -(bStack_81 == bVar44);
    auVar46[8] = -(uStack_80 == uVar34);
    auVar46[9] = -(uStack_7f == uVar40);
    auVar46[10] = -(uStack_7e == uVar42);
    auVar46[0xb] = -(bStack_7d == bVar44);
    auVar46[0xc] = -(uStack_7c == uVar34);
    auVar46[0xd] = -(uStack_7b == uVar40);
    auVar46[0xe] = -(uStack_7a == uVar42);
    auVar46[0xf] = -(bStack_79 == bVar44);
    for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar46 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar46 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar46 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar46 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar46 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar46 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar46 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar46 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar46 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar46 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar46 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar46 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar46 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar46 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar46 >> 0x77,0) & 1) << 0xe); uVar18 != 0;
        uVar18 = uVar18 - 1 & uVar18) {
      iVar17 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if ((*(long *)((long)&local_270.commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.elements_[uVar24 * 0xf].first._M_len +
                    (ulong)(uint)(iVar17 << 6)) == 5) &&
         (ppVar31 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                     *)((long)&local_270.commentHandlers.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                               .arrays.elements_[uVar24 * 0xf].first._M_len +
                       (ulong)(uint)(iVar17 << 6)), piVar6 = (int *)(ppVar31->first)._M_str,
         (char)piVar6[1] == 'g' && *piVar6 == 0x6e616c73)) goto LAB_0018ecba;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bStack_79) == 0) break;
    p_Var12 = &pbVar30->_M_dataplus;
    pbVar30 = (pointer)((long)&(pbVar30->_M_dataplus)._M_p + 1);
    uVar24 = (ulong)((long)&p_Var12->_M_p + uVar24 + 1) &
             local_270.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_size_mask;
  } while (pbVar30 <=
           local_270.commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.groups_size_mask);
  if (local_270.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.size <
      local_270.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&local_270,(arrays_type *)&local_270,uVar22,uVar20,
               (try_emplace_args_t *)&local_290,&local_280);
    local_270.commentHandlers.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
    .size_ctrl.size =
         local_270.commentHandlers.table_.
         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
         .size_ctrl.size + 1;
    ppVar31 = local_298;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&local_270,uVar20,(try_emplace_args_t *)&local_290,&local_280);
    ppVar31 = local_298;
  }
LAB_0018ecba:
  puVar4 = &ppVar31->second;
  local_290._M_len = 8;
  local_290._M_str = "lint_off";
  uVar20 = detail::hashing::hash("lint_off",8);
  uVar29 = uVar20 >> ((byte)(ppVar31->second).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar20 & 0xff];
  uVar22 = 0;
  uVar24 = uVar29;
  do {
    pgVar21 = (ppVar31->second).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
              .arrays.groups_ + uVar24;
    local_98 = pgVar21->m[0].n;
    uStack_97 = pgVar21->m[1].n;
    uStack_96 = pgVar21->m[2].n;
    bStack_95 = pgVar21->m[3].n;
    uStack_94 = pgVar21->m[4].n;
    uStack_93 = pgVar21->m[5].n;
    uStack_92 = pgVar21->m[6].n;
    bStack_91 = pgVar21->m[7].n;
    uStack_90 = pgVar21->m[8].n;
    uStack_8f = pgVar21->m[9].n;
    uStack_8e = pgVar21->m[10].n;
    bStack_8d = pgVar21->m[0xb].n;
    uStack_8c = pgVar21->m[0xc].n;
    uStack_8b = pgVar21->m[0xd].n;
    uStack_8a = pgVar21->m[0xe].n;
    bStack_89 = pgVar21->m[0xf].n;
    uVar34 = (uchar)uVar5;
    auVar47[0] = -(local_98 == uVar34);
    uVar40 = (uchar)((uint)uVar5 >> 8);
    auVar47[1] = -(uStack_97 == uVar40);
    uVar42 = (uchar)((uint)uVar5 >> 0x10);
    auVar47[2] = -(uStack_96 == uVar42);
    bVar44 = (byte)((uint)uVar5 >> 0x18);
    auVar47[3] = -(bStack_95 == bVar44);
    auVar47[4] = -(uStack_94 == uVar34);
    auVar47[5] = -(uStack_93 == uVar40);
    auVar47[6] = -(uStack_92 == uVar42);
    auVar47[7] = -(bStack_91 == bVar44);
    auVar47[8] = -(uStack_90 == uVar34);
    auVar47[9] = -(uStack_8f == uVar40);
    auVar47[10] = -(uStack_8e == uVar42);
    auVar47[0xb] = -(bStack_8d == bVar44);
    auVar47[0xc] = -(uStack_8c == uVar34);
    auVar47[0xd] = -(uStack_8b == uVar40);
    auVar47[0xe] = -(uStack_8a == uVar42);
    auVar47[0xf] = -(bStack_89 == bVar44);
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar47 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar47 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar47 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar47 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar47 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar47 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar47 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar47 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar47 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar47 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar47 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar47 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar47 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar47 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar47 >> 0x77,0) & 1) << 0xe);
    if (uVar18 != 0) {
      ppVar7 = (ppVar31->second).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
               .arrays.elements_;
      do {
        uVar11 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        if ((ppVar7[uVar24 * 0xf + (ulong)uVar11].first._M_len == 8) &&
           (ppVar25 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                       *)(ppVar7 + uVar24 * 0xf + (ulong)uVar11),
           *(long *)(ppVar25->first)._M_str == 0x66666f5f746e696c)) goto LAB_0018eded;
        uVar18 = uVar18 - 1 & uVar18;
      } while (uVar18 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bStack_89) == 0) break;
    uVar8 = (ppVar31->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .arrays.groups_size_mask;
    uVar24 = uVar22 + uVar24 + 1;
    uVar22 = uVar22 + 1;
    uVar24 = uVar24 & uVar8;
  } while (uVar22 <= uVar8);
  if ((ppVar31->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.size <
      (ppVar31->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)puVar4,(arrays_type *)puVar4,uVar29,uVar20,&local_2a9,&local_290);
    psVar1 = &(ppVar31->second).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
    ppVar25 = local_298;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)puVar4,uVar20,&local_2a9,&local_290);
    ppVar25 = local_298;
  }
LAB_0018eded:
  *(undefined4 *)
   &(ppVar25->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_size_index = 3;
  (ppVar25->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_size_mask = 0;
  (ppVar25->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  local_280._M_len = 5;
  local_280._M_str = "slang";
  uVar20 = detail::hashing::hash("slang",5);
  uVar22 = uVar20 >> ((byte)local_270.commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar20 & 0xff];
  pbVar30 = (pointer)0x0;
  uVar24 = uVar22;
  do {
    pgVar3 = local_270.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_ + uVar24;
    local_a8 = pgVar3->m[0].n;
    uStack_a7 = pgVar3->m[1].n;
    uStack_a6 = pgVar3->m[2].n;
    bStack_a5 = pgVar3->m[3].n;
    uStack_a4 = pgVar3->m[4].n;
    uStack_a3 = pgVar3->m[5].n;
    uStack_a2 = pgVar3->m[6].n;
    bStack_a1 = pgVar3->m[7].n;
    uStack_a0 = pgVar3->m[8].n;
    uStack_9f = pgVar3->m[9].n;
    uStack_9e = pgVar3->m[10].n;
    bStack_9d = pgVar3->m[0xb].n;
    uStack_9c = pgVar3->m[0xc].n;
    uStack_9b = pgVar3->m[0xd].n;
    uStack_9a = pgVar3->m[0xe].n;
    bStack_99 = pgVar3->m[0xf].n;
    uVar34 = (uchar)uVar5;
    auVar48[0] = -(local_a8 == uVar34);
    uVar40 = (uchar)((uint)uVar5 >> 8);
    auVar48[1] = -(uStack_a7 == uVar40);
    uVar42 = (uchar)((uint)uVar5 >> 0x10);
    auVar48[2] = -(uStack_a6 == uVar42);
    bVar44 = (byte)((uint)uVar5 >> 0x18);
    auVar48[3] = -(bStack_a5 == bVar44);
    auVar48[4] = -(uStack_a4 == uVar34);
    auVar48[5] = -(uStack_a3 == uVar40);
    auVar48[6] = -(uStack_a2 == uVar42);
    auVar48[7] = -(bStack_a1 == bVar44);
    auVar48[8] = -(uStack_a0 == uVar34);
    auVar48[9] = -(uStack_9f == uVar40);
    auVar48[10] = -(uStack_9e == uVar42);
    auVar48[0xb] = -(bStack_9d == bVar44);
    auVar48[0xc] = -(uStack_9c == uVar34);
    auVar48[0xd] = -(uStack_9b == uVar40);
    auVar48[0xe] = -(uStack_9a == uVar42);
    auVar48[0xf] = -(bStack_99 == bVar44);
    for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar48 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar48 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar48 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar48 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar48 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar48 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar48 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar48 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar48 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar48 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar48 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar48 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar48 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar48 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar48 >> 0x77,0) & 1) << 0xe); uVar18 != 0;
        uVar18 = uVar18 - 1 & uVar18) {
      iVar17 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if ((*(long *)((long)&local_270.commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.elements_[uVar24 * 0xf].first._M_len +
                    (ulong)(uint)(iVar17 << 6)) == 5) &&
         (ppVar31 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                     *)((long)&local_270.commentHandlers.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                               .arrays.elements_[uVar24 * 0xf].first._M_len +
                       (ulong)(uint)(iVar17 << 6)), piVar6 = (int *)(ppVar31->first)._M_str,
         (char)piVar6[1] == 'g' && *piVar6 == 0x6e616c73)) goto LAB_0018ef33;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bStack_99) == 0) break;
    p_Var12 = &pbVar30->_M_dataplus;
    pbVar30 = (pointer)((long)&(pbVar30->_M_dataplus)._M_p + 1);
    uVar24 = (ulong)((long)&p_Var12->_M_p + uVar24 + 1) &
             local_270.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_size_mask;
  } while (pbVar30 <=
           local_270.commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.groups_size_mask);
  if (local_270.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.size <
      local_270.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&local_270,(arrays_type *)&local_270,uVar22,uVar20,
               (try_emplace_args_t *)&local_290,&local_280);
    local_270.commentHandlers.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
    .size_ctrl.size =
         local_270.commentHandlers.table_.
         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
         .size_ctrl.size + 1;
    ppVar31 = local_298;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&local_270,uVar20,(try_emplace_args_t *)&local_290,&local_280);
    ppVar31 = local_298;
  }
LAB_0018ef33:
  local_228 = (basic_string_view<char,_std::char_traits<char>_> *)&ppVar31->second;
  local_290._M_len = 7;
  local_290._M_str = "lint_on";
  uVar20 = detail::hashing::hash("lint_on",7);
  uVar29 = uVar20 >> ((byte)(ppVar31->second).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar20 & 0xff];
  uVar22 = 0;
  uVar24 = uVar29;
  do {
    pgVar21 = (ppVar31->second).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
              .arrays.groups_ + uVar24;
    local_b8 = pgVar21->m[0].n;
    uStack_b7 = pgVar21->m[1].n;
    uStack_b6 = pgVar21->m[2].n;
    bStack_b5 = pgVar21->m[3].n;
    uStack_b4 = pgVar21->m[4].n;
    uStack_b3 = pgVar21->m[5].n;
    uStack_b2 = pgVar21->m[6].n;
    bStack_b1 = pgVar21->m[7].n;
    uStack_b0 = pgVar21->m[8].n;
    uStack_af = pgVar21->m[9].n;
    uStack_ae = pgVar21->m[10].n;
    bStack_ad = pgVar21->m[0xb].n;
    uStack_ac = pgVar21->m[0xc].n;
    uStack_ab = pgVar21->m[0xd].n;
    uStack_aa = pgVar21->m[0xe].n;
    bStack_a9 = pgVar21->m[0xf].n;
    uVar34 = (uchar)uVar5;
    auVar49[0] = -(local_b8 == uVar34);
    uVar40 = (uchar)((uint)uVar5 >> 8);
    auVar49[1] = -(uStack_b7 == uVar40);
    uVar42 = (uchar)((uint)uVar5 >> 0x10);
    auVar49[2] = -(uStack_b6 == uVar42);
    bVar44 = (byte)((uint)uVar5 >> 0x18);
    auVar49[3] = -(bStack_b5 == bVar44);
    auVar49[4] = -(uStack_b4 == uVar34);
    auVar49[5] = -(uStack_b3 == uVar40);
    auVar49[6] = -(uStack_b2 == uVar42);
    auVar49[7] = -(bStack_b1 == bVar44);
    auVar49[8] = -(uStack_b0 == uVar34);
    auVar49[9] = -(uStack_af == uVar40);
    auVar49[10] = -(uStack_ae == uVar42);
    auVar49[0xb] = -(bStack_ad == bVar44);
    auVar49[0xc] = -(uStack_ac == uVar34);
    auVar49[0xd] = -(uStack_ab == uVar40);
    auVar49[0xe] = -(uStack_aa == uVar42);
    auVar49[0xf] = -(bStack_a9 == bVar44);
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe);
    if (uVar18 != 0) {
      ppVar7 = (ppVar31->second).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
               .arrays.elements_;
      do {
        uVar11 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        if ((ppVar7[uVar24 * 0xf + (ulong)uVar11].first._M_len == 7) &&
           (ppVar25 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                       *)(ppVar7 + uVar24 * 0xf + (ulong)uVar11),
           piVar6 = (int *)(ppVar25->first)._M_str,
           *(int *)((long)piVar6 + 3) == 0x6e6f5f74 && *piVar6 == 0x746e696c)) goto LAB_0018f08c;
        uVar18 = uVar18 - 1 & uVar18;
      } while (uVar18 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bStack_a9) == 0) break;
    uVar8 = (ppVar31->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .arrays.groups_size_mask;
    uVar24 = uVar22 + uVar24 + 1;
    uVar22 = uVar22 + 1;
    uVar24 = uVar24 & uVar8;
  } while (uVar22 <= uVar8);
  if ((ppVar31->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.size <
      (ppVar31->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)local_228,(arrays_type *)local_228,uVar29,uVar20,&local_2a9,&local_290);
    psVar1 = &(ppVar31->second).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
    ppVar25 = local_298;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)local_228,uVar20,&local_2a9,&local_290);
    ppVar25 = local_298;
  }
LAB_0018f08c:
  *(undefined4 *)
   &(ppVar25->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_size_index = 2;
  (ppVar25->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_size_mask = 0;
  (ppVar25->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  local_280._M_len = 5;
  local_280._M_str = "slang";
  uVar20 = detail::hashing::hash("slang",5);
  uVar22 = uVar20 >> ((byte)local_270.commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar20 & 0xff];
  pbVar30 = (pointer)0x0;
  uVar24 = uVar22;
  do {
    pgVar3 = local_270.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_ + uVar24;
    local_c8 = pgVar3->m[0].n;
    uStack_c7 = pgVar3->m[1].n;
    uStack_c6 = pgVar3->m[2].n;
    bStack_c5 = pgVar3->m[3].n;
    uStack_c4 = pgVar3->m[4].n;
    uStack_c3 = pgVar3->m[5].n;
    uStack_c2 = pgVar3->m[6].n;
    bStack_c1 = pgVar3->m[7].n;
    uStack_c0 = pgVar3->m[8].n;
    uStack_bf = pgVar3->m[9].n;
    uStack_be = pgVar3->m[10].n;
    bStack_bd = pgVar3->m[0xb].n;
    uStack_bc = pgVar3->m[0xc].n;
    uStack_bb = pgVar3->m[0xd].n;
    uStack_ba = pgVar3->m[0xe].n;
    bStack_b9 = pgVar3->m[0xf].n;
    uVar34 = (uchar)uVar5;
    auVar50[0] = -(local_c8 == uVar34);
    uVar40 = (uchar)((uint)uVar5 >> 8);
    auVar50[1] = -(uStack_c7 == uVar40);
    uVar42 = (uchar)((uint)uVar5 >> 0x10);
    auVar50[2] = -(uStack_c6 == uVar42);
    bVar44 = (byte)((uint)uVar5 >> 0x18);
    auVar50[3] = -(bStack_c5 == bVar44);
    auVar50[4] = -(uStack_c4 == uVar34);
    auVar50[5] = -(uStack_c3 == uVar40);
    auVar50[6] = -(uStack_c2 == uVar42);
    auVar50[7] = -(bStack_c1 == bVar44);
    auVar50[8] = -(uStack_c0 == uVar34);
    auVar50[9] = -(uStack_bf == uVar40);
    auVar50[10] = -(uStack_be == uVar42);
    auVar50[0xb] = -(bStack_bd == bVar44);
    auVar50[0xc] = -(uStack_bc == uVar34);
    auVar50[0xd] = -(uStack_bb == uVar40);
    auVar50[0xe] = -(uStack_ba == uVar42);
    auVar50[0xf] = -(bStack_b9 == bVar44);
    for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar50 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar50 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar50 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar50 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar50 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar50 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar50 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar50 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar50 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar50 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar50 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar50 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar50 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar50 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar50 >> 0x77,0) & 1) << 0xe); uVar18 != 0;
        uVar18 = uVar18 - 1 & uVar18) {
      iVar17 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if ((*(long *)((long)&local_270.commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.elements_[uVar24 * 0xf].first._M_len +
                    (ulong)(uint)(iVar17 << 6)) == 5) &&
         (ppVar31 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                     *)((long)&local_270.commentHandlers.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                               .arrays.elements_[uVar24 * 0xf].first._M_len +
                       (ulong)(uint)(iVar17 << 6)), piVar6 = (int *)(ppVar31->first)._M_str,
         (char)piVar6[1] == 'g' && *piVar6 == 0x6e616c73)) goto LAB_0018f1d2;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bStack_b9) == 0) break;
    p_Var12 = &pbVar30->_M_dataplus;
    pbVar30 = (pointer)((long)&(pbVar30->_M_dataplus)._M_p + 1);
    uVar24 = (ulong)((long)&p_Var12->_M_p + uVar24 + 1) &
             local_270.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_size_mask;
  } while (pbVar30 <=
           local_270.commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.groups_size_mask);
  if (local_270.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.size <
      local_270.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&local_270,(arrays_type *)&local_270,uVar22,uVar20,
               (try_emplace_args_t *)&local_290,&local_280);
    local_270.commentHandlers.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
    .size_ctrl.size =
         local_270.commentHandlers.table_.
         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
         .size_ctrl.size + 1;
    ppVar31 = local_298;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&local_270,uVar20,(try_emplace_args_t *)&local_290,&local_280);
    ppVar31 = local_298;
  }
LAB_0018f1d2:
  puVar4 = &ppVar31->second;
  local_290._M_len = 9;
  local_290._M_str = "lint_save";
  uVar20 = detail::hashing::hash("lint_save",9);
  uVar29 = uVar20 >> ((byte)(ppVar31->second).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar20 & 0xff];
  uVar22 = 0;
  uVar24 = uVar29;
  do {
    pgVar21 = (ppVar31->second).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
              .arrays.groups_ + uVar24;
    local_d8 = pgVar21->m[0].n;
    uStack_d7 = pgVar21->m[1].n;
    uStack_d6 = pgVar21->m[2].n;
    bStack_d5 = pgVar21->m[3].n;
    uStack_d4 = pgVar21->m[4].n;
    uStack_d3 = pgVar21->m[5].n;
    uStack_d2 = pgVar21->m[6].n;
    bStack_d1 = pgVar21->m[7].n;
    uStack_d0 = pgVar21->m[8].n;
    uStack_cf = pgVar21->m[9].n;
    uStack_ce = pgVar21->m[10].n;
    bStack_cd = pgVar21->m[0xb].n;
    uStack_cc = pgVar21->m[0xc].n;
    uStack_cb = pgVar21->m[0xd].n;
    uStack_ca = pgVar21->m[0xe].n;
    bStack_c9 = pgVar21->m[0xf].n;
    uVar34 = (uchar)uVar5;
    auVar51[0] = -(local_d8 == uVar34);
    uVar40 = (uchar)((uint)uVar5 >> 8);
    auVar51[1] = -(uStack_d7 == uVar40);
    uVar42 = (uchar)((uint)uVar5 >> 0x10);
    auVar51[2] = -(uStack_d6 == uVar42);
    bVar44 = (byte)((uint)uVar5 >> 0x18);
    auVar51[3] = -(bStack_d5 == bVar44);
    auVar51[4] = -(uStack_d4 == uVar34);
    auVar51[5] = -(uStack_d3 == uVar40);
    auVar51[6] = -(uStack_d2 == uVar42);
    auVar51[7] = -(bStack_d1 == bVar44);
    auVar51[8] = -(uStack_d0 == uVar34);
    auVar51[9] = -(uStack_cf == uVar40);
    auVar51[10] = -(uStack_ce == uVar42);
    auVar51[0xb] = -(bStack_cd == bVar44);
    auVar51[0xc] = -(uStack_cc == uVar34);
    auVar51[0xd] = -(uStack_cb == uVar40);
    auVar51[0xe] = -(uStack_ca == uVar42);
    auVar51[0xf] = -(bStack_c9 == bVar44);
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar51 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar51 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar51 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar51 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar51 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar51 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar51 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar51 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar51 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar51 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar51 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar51 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar51 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar51 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar51 >> 0x77,0) & 1) << 0xe);
    if (uVar18 != 0) {
      ppVar7 = (ppVar31->second).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
               .arrays.elements_;
      do {
        uVar11 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        if ((ppVar7[uVar24 * 0xf + (ulong)uVar11].first._M_len == 9) &&
           (ppVar25 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                       *)(ppVar7 + uVar24 * 0xf + (ulong)uVar11),
           plVar9 = (long *)(ppVar25->first)._M_str,
           (char)plVar9[1] == 'e' && *plVar9 == 0x7661735f746e696c)) goto LAB_0018f313;
        uVar18 = uVar18 - 1 & uVar18;
      } while (uVar18 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bStack_c9) == 0) break;
    uVar8 = (ppVar31->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .arrays.groups_size_mask;
    uVar24 = uVar22 + uVar24 + 1;
    uVar22 = uVar22 + 1;
    uVar24 = uVar24 & uVar8;
  } while (uVar22 <= uVar8);
  if ((ppVar31->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.size <
      (ppVar31->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)puVar4,(arrays_type *)puVar4,uVar29,uVar20,&local_2a9,&local_290);
    psVar1 = &(ppVar31->second).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
    ppVar25 = local_298;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)puVar4,uVar20,&local_2a9,&local_290);
    ppVar25 = local_298;
  }
LAB_0018f313:
  *(undefined4 *)
   &(ppVar25->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_size_index = 4;
  (ppVar25->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_size_mask = 0;
  (ppVar25->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  local_280._M_len = 5;
  local_280._M_str = "slang";
  uVar20 = detail::hashing::hash("slang",5);
  uVar22 = uVar20 >> ((byte)local_270.commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar20 & 0xff];
  pbVar30 = (pointer)0x0;
  uVar24 = uVar22;
  do {
    pgVar3 = local_270.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_ + uVar24;
    local_e8 = pgVar3->m[0].n;
    uStack_e7 = pgVar3->m[1].n;
    uStack_e6 = pgVar3->m[2].n;
    bStack_e5 = pgVar3->m[3].n;
    uStack_e4 = pgVar3->m[4].n;
    uStack_e3 = pgVar3->m[5].n;
    uStack_e2 = pgVar3->m[6].n;
    bStack_e1 = pgVar3->m[7].n;
    uStack_e0 = pgVar3->m[8].n;
    uStack_df = pgVar3->m[9].n;
    uStack_de = pgVar3->m[10].n;
    bStack_dd = pgVar3->m[0xb].n;
    uStack_dc = pgVar3->m[0xc].n;
    uStack_db = pgVar3->m[0xd].n;
    uStack_da = pgVar3->m[0xe].n;
    bStack_d9 = pgVar3->m[0xf].n;
    uVar34 = (uchar)uVar5;
    auVar52[0] = -(local_e8 == uVar34);
    uVar40 = (uchar)((uint)uVar5 >> 8);
    auVar52[1] = -(uStack_e7 == uVar40);
    uVar42 = (uchar)((uint)uVar5 >> 0x10);
    auVar52[2] = -(uStack_e6 == uVar42);
    bVar44 = (byte)((uint)uVar5 >> 0x18);
    auVar52[3] = -(bStack_e5 == bVar44);
    auVar52[4] = -(uStack_e4 == uVar34);
    auVar52[5] = -(uStack_e3 == uVar40);
    auVar52[6] = -(uStack_e2 == uVar42);
    auVar52[7] = -(bStack_e1 == bVar44);
    auVar52[8] = -(uStack_e0 == uVar34);
    auVar52[9] = -(uStack_df == uVar40);
    auVar52[10] = -(uStack_de == uVar42);
    auVar52[0xb] = -(bStack_dd == bVar44);
    auVar52[0xc] = -(uStack_dc == uVar34);
    auVar52[0xd] = -(uStack_db == uVar40);
    auVar52[0xe] = -(uStack_da == uVar42);
    auVar52[0xf] = -(bStack_d9 == bVar44);
    for (uVar18 = (uint)(ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe); uVar18 != 0;
        uVar18 = uVar18 - 1 & uVar18) {
      iVar17 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> iVar17 & 1) == 0; iVar17 = iVar17 + 1) {
        }
      }
      if ((*(long *)((long)&local_270.commentHandlers.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                            .arrays.elements_[uVar24 * 0xf].first._M_len +
                    (ulong)(uint)(iVar17 << 6)) == 5) &&
         (ppVar31 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                     *)((long)&local_270.commentHandlers.table_.
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
                               .arrays.elements_[uVar24 * 0xf].first._M_len +
                       (ulong)(uint)(iVar17 << 6)), piVar6 = (int *)(ppVar31->first)._M_str,
         (char)piVar6[1] == 'g' && *piVar6 == 0x6e616c73)) goto LAB_0018f458;
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bStack_d9) == 0) break;
    p_Var12 = &pbVar30->_M_dataplus;
    pbVar30 = (pointer)((long)&(pbVar30->_M_dataplus)._M_p + 1);
    uVar24 = (ulong)((long)&p_Var12->_M_p + uVar24 + 1) &
             local_270.commentHandlers.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
             .arrays.groups_size_mask;
  } while (pbVar30 <=
           local_270.commentHandlers.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
           .arrays.groups_size_mask);
  if (local_270.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.size <
      local_270.commentHandlers.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&local_270,(arrays_type *)&local_270,uVar22,uVar20,
               (try_emplace_args_t *)&local_290,&local_280);
    local_270.commentHandlers.table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
    .size_ctrl.size =
         local_270.commentHandlers.table_.
         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_boost::unordered::unordered_flat_map<std::basic_string_view<char>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char>_>_>_>_>_>
         .size_ctrl.size + 1;
    ppVar31 = local_298;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,boost::unordered::unordered_flat_map<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>>>>
                *)&local_270,uVar20,(try_emplace_args_t *)&local_290,&local_280);
    ppVar31 = local_298;
  }
LAB_0018f458:
  puVar4 = &ppVar31->second;
  local_290._M_len = 0xc;
  local_290._M_str = "lint_restore";
  uVar20 = detail::hashing::hash("lint_restore",0xc);
  uVar29 = uVar20 >> ((byte)(ppVar31->second).table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar20 & 0xff];
  uVar22 = 0;
  uVar24 = uVar29;
  do {
    pgVar21 = (ppVar31->second).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
              .arrays.groups_ + uVar24;
    local_f8 = pgVar21->m[0].n;
    uStack_f7 = pgVar21->m[1].n;
    uStack_f6 = pgVar21->m[2].n;
    bStack_f5 = pgVar21->m[3].n;
    uStack_f4 = pgVar21->m[4].n;
    uStack_f3 = pgVar21->m[5].n;
    uStack_f2 = pgVar21->m[6].n;
    bStack_f1 = pgVar21->m[7].n;
    uStack_f0 = pgVar21->m[8].n;
    uStack_ef = pgVar21->m[9].n;
    uStack_ee = pgVar21->m[10].n;
    bStack_ed = pgVar21->m[0xb].n;
    uStack_ec = pgVar21->m[0xc].n;
    uStack_eb = pgVar21->m[0xd].n;
    uStack_ea = pgVar21->m[0xe].n;
    bStack_e9 = pgVar21->m[0xf].n;
    uVar34 = (uchar)uVar5;
    auVar53[0] = -(local_f8 == uVar34);
    uVar40 = (uchar)((uint)uVar5 >> 8);
    auVar53[1] = -(uStack_f7 == uVar40);
    uVar42 = (uchar)((uint)uVar5 >> 0x10);
    auVar53[2] = -(uStack_f6 == uVar42);
    bVar44 = (byte)((uint)uVar5 >> 0x18);
    auVar53[3] = -(bStack_f5 == bVar44);
    auVar53[4] = -(uStack_f4 == uVar34);
    auVar53[5] = -(uStack_f3 == uVar40);
    auVar53[6] = -(uStack_f2 == uVar42);
    auVar53[7] = -(bStack_f1 == bVar44);
    auVar53[8] = -(uStack_f0 == uVar34);
    auVar53[9] = -(uStack_ef == uVar40);
    auVar53[10] = -(uStack_ee == uVar42);
    auVar53[0xb] = -(bStack_ed == bVar44);
    auVar53[0xc] = -(uStack_ec == uVar34);
    auVar53[0xd] = -(uStack_eb == uVar40);
    auVar53[0xe] = -(uStack_ea == uVar42);
    auVar53[0xf] = -(bStack_e9 == bVar44);
    uVar18 = (uint)(ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe);
    if (uVar18 != 0) {
      ppVar7 = (ppVar31->second).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
               .arrays.elements_;
      do {
        uVar11 = 0;
        if (uVar18 != 0) {
          for (; (uVar18 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        if ((ppVar7[uVar24 * 0xf + (ulong)uVar11].first._M_len == 0xc) &&
           (ppVar25 = (pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>
                       *)(ppVar7 + uVar24 * 0xf + (ulong)uVar11),
           plVar9 = (long *)(ppVar25->first)._M_str,
           (int)plVar9[1] == 0x65726f74 && *plVar9 == 0x7365725f746e696c)) goto LAB_0018f59c;
        uVar18 = uVar18 - 1 & uVar18;
      } while (uVar18 != 0);
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar20 & 7] & bStack_e9) == 0) break;
    uVar8 = (ppVar31->second).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
            .arrays.groups_size_mask;
    uVar24 = uVar22 + uVar24 + 1;
    uVar22 = uVar22 + 1;
    uVar24 = uVar24 & uVar8;
  } while (uVar22 <= uVar8);
  if ((ppVar31->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.size <
      (ppVar31->second).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)puVar4,(arrays_type *)puVar4,uVar29,uVar20,&local_2a9,&local_290);
    psVar1 = &(ppVar31->second).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
              .size_ctrl.size;
    *psVar1 = *psVar1 + 1;
    ppVar25 = local_298;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>>
              ((locator *)local_2a8,
               (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::parsing::CommentHandler>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::parsing::CommentHandler>>>
                *)puVar4,uVar20,&local_2a9,&local_290);
    ppVar25 = local_298;
  }
LAB_0018f59c:
  this_00 = local_1a0;
  *(undefined4 *)
   &(ppVar25->second).table_.
    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
    .arrays.groups_size_index = 5;
  (ppVar25->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_size_mask = 0;
  (ppVar25->second).table_.
  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::parsing::CommentHandler>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::parsing::CommentHandler>_>_>
  .arrays.groups_ = (group_type_pointer)0x0;
  local_2a8._0_4_ = 0x400;
  if ((local_1e8->options).maxParseDepth.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    local_2a8._0_4_ =
         (local_1e8->options).maxParseDepth.super__Optional_base<unsigned_int,_true,_true>.
         _M_payload.super__Optional_payload_base<unsigned_int>._M_payload._M_value;
  }
  local_2a8._4_4_ = local_1e8->languageVersion;
  Bag::set<slang::driver::SourceOptions&>(local_1a0,&local_1c8);
  Bag::set<slang::parsing::PreprocessorOptions&>(this_00,(PreprocessorOptions *)local_198);
  Bag::set<slang::parsing::LexerOptions&>(this_00,&local_270);
  Bag::set<slang::parsing::ParserOptions&>(this_00,(ParserOptions *)local_2a8);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::parsing::CommentHandler>_>_>_>_>_>
                 *)&local_270);
  if (local_110 != (value_type_pointer)0x0) {
    operator_delete(local_110,local_120 * 0x100 + 0x100);
  }
  std::vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_>::
  ~vector((vector<std::filesystem::__cxx11::path,_std::allocator<std::filesystem::__cxx11::path>_> *
          )local_140);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_170);
  if ((undefined1 *)local_198._8_8_ != local_198 + 0x18) {
    operator_delete((void *)local_198._8_8_,
                    CONCAT26(local_198._30_2_,CONCAT24(local_198._28_2_,local_198._24_4_)) + 1);
  }
  return;
}

Assistant:

void Driver::addParseOptions(Bag& bag) const {
    SourceOptions soptions;
    soptions.numThreads = options.numThreads;
    soptions.singleUnit = options.singleUnit == true;
    soptions.onlyLint = options.lintMode();
    soptions.librariesInheritMacros = options.librariesInheritMacros == true;

    PreprocessorOptions ppoptions;
    ppoptions.predefines = options.defines;
    ppoptions.undefines = options.undefines;
    ppoptions.predefineSource = "<command-line>";
    ppoptions.languageVersion = languageVersion;
    if (options.maxIncludeDepth.has_value())
        ppoptions.maxIncludeDepth = *options.maxIncludeDepth;
    for (const auto& d : options.ignoreDirectives)
        ppoptions.ignoreDirectives.emplace(d);

    LexerOptions loptions;
    loptions.languageVersion = languageVersion;
    loptions.enableLegacyProtect = options.enableLegacyProtect == true;
    if (options.maxLexerErrors.has_value())
        loptions.maxErrors = *options.maxLexerErrors;

    if (loptions.enableLegacyProtect)
        loptions.commentHandlers["pragma"]["protect"] = {CommentHandler::Protect};

    for (auto& [common, start, end] : translateOffFormats)
        loptions.commentHandlers[common][start] = {CommentHandler::TranslateOff, end};

    loptions.commentHandlers["slang"]["lint_off"] = {CommentHandler::LintOff};
    loptions.commentHandlers["slang"]["lint_on"] = {CommentHandler::LintOn};
    loptions.commentHandlers["slang"]["lint_save"] = {CommentHandler::LintSave};
    loptions.commentHandlers["slang"]["lint_restore"] = {CommentHandler::LintRestore};

    ParserOptions poptions;
    poptions.languageVersion = languageVersion;
    if (options.maxParseDepth.has_value())
        poptions.maxRecursionDepth = *options.maxParseDepth;

    bag.set(soptions);
    bag.set(ppoptions);
    bag.set(loptions);
    bag.set(poptions);
}